

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,Type type)

{
  bool bVar1;
  BasicType BVar2;
  BasicHeapType BVar3;
  uint uVar4;
  Tuple *tuple;
  ostream *poVar5;
  char *pcVar6;
  HeapType local_28;
  HeapType heapType;
  Type type_local;
  
  heapType.id = type.id;
  if (type.id < 7) {
    BVar2 = wasm::Type::getBasic((Type *)&heapType);
    switch(BVar2) {
    case none:
      poVar5 = this->os;
      pcVar6 = "none";
      break;
    case unreachable:
      poVar5 = this->os;
      pcVar6 = "unreachable";
      break;
    case i32:
      poVar5 = this->os;
      pcVar6 = "i32";
      break;
    case i64:
      poVar5 = this->os;
      pcVar6 = "i64";
      break;
    case f32:
      poVar5 = this->os;
      pcVar6 = "f32";
      break;
    case f64:
      poVar5 = this->os;
      pcVar6 = "f64";
      break;
    case v128:
      poVar5 = this->os;
      pcVar6 = "v128";
      break;
    default:
      goto switchD_00cfba06_default;
    }
    poVar5 = std::operator<<(poVar5,pcVar6);
    return poVar5;
  }
switchD_00cfba06_default:
  if ((heapType.id & 1) == 0 || heapType.id < 7) {
    if ((heapType.id < 7) || ((heapType.id & 1) != 0)) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x6d3);
    }
    local_28 = wasm::Type::getHeapType((Type *)&heapType);
    if (((0x7c < local_28.id || heapType.id < 7) || ((uint)heapType.id & 3) != 2) ||
       (bVar1 = HeapType::isShared(&local_28), bVar1)) {
      std::operator<<(this->os,"(ref ");
      if (((uint)heapType.id & 3) == 2 && 6 < heapType.id) {
        std::operator<<(this->os,"null ");
      }
      bVar1 = wasm::Type::isExact((Type *)&heapType);
      if (bVar1) {
        std::operator<<(this->os,"(exact ");
      }
      printHeapTypeName(this,local_28);
      bVar1 = wasm::Type::isExact((Type *)&heapType);
      if (bVar1) {
        std::operator<<(this->os,')');
      }
    }
    else {
      bVar1 = wasm::Type::isExact((Type *)&heapType);
      if (bVar1) {
        std::operator<<(this->os,"(exact ");
      }
      BVar3 = HeapType::getBasic(&local_28,Unshared);
      uVar4 = BVar3 << 0x1d | BVar3 - ext >> 3;
      if (uVar4 < 0xf) {
        std::operator<<(this->os,&DAT_00e5b7dc + *(int *)(&DAT_00e5b7dc + (ulong)uVar4 * 4));
      }
      bVar1 = wasm::Type::isExact((Type *)&heapType);
      if (!bVar1) goto LAB_00cfbba0;
    }
    std::operator<<(this->os,')');
  }
  else {
    tuple = wasm::Type::getTuple((Type *)&heapType);
    print(this,tuple);
  }
LAB_00cfbba0:
  return this->os;
}

Assistant:

std::ostream& TypePrinter::print(Type type) {
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::none:
        return os << "none";
      case Type::unreachable:
        return os << "unreachable";
      case Type::i32:
        return os << "i32";
      case Type::i64:
        return os << "i64";
      case Type::f32:
        return os << "f32";
      case Type::f64:
        return os << "f64";
      case Type::v128:
        return os << "v128";
    }
  }

#if TRACE_CANONICALIZATION
  os << "(;" << ((type.getID() >> 4) % 1000) << ";) ";
#endif
  if (type.isTuple()) {
    print(type.getTuple());
  } else if (type.isRef()) {
    auto heapType = type.getHeapType();
    if (type.isNullable() && heapType.isBasic() && !heapType.isShared()) {
      if (type.isExact()) {
        os << "(exact ";
      }
      // Print shorthands for certain basic heap types.
      switch (heapType.getBasic(Unshared)) {
        case HeapType::ext:
          os << "externref";
          break;
        case HeapType::func:
          os << "funcref";
          break;
        case HeapType::cont:
          os << "contref";
          break;
        case HeapType::any:
          os << "anyref";
          break;
        case HeapType::eq:
          os << "eqref";
          break;
        case HeapType::i31:
          os << "i31ref";
          break;
        case HeapType::struct_:
          os << "structref";
          break;
        case HeapType::array:
          os << "arrayref";
          break;
        case HeapType::exn:
          os << "exnref";
          break;
        case HeapType::string:
          os << "stringref";
          break;
        case HeapType::none:
          os << "nullref";
          break;
        case HeapType::noext:
          os << "nullexternref";
          break;
        case HeapType::nofunc:
          os << "nullfuncref";
          break;
        case HeapType::nocont:
          os << "nullcontref";
          break;
        case HeapType::noexn:
          os << "nullexnref";
          break;
      }
      if (type.isExact()) {
        os << ')';
      }
      return os;
    }
    os << "(ref ";
    if (type.isNullable()) {
      os << "null ";
    }
    if (type.isExact()) {
      os << "(exact ";
    }
    printHeapTypeName(heapType);
    if (type.isExact()) {
      os << ')';
    }
    os << ')';
  } else {
    WASM_UNREACHABLE("unexpected type");
  }
  return os;
}